

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpGetHttpResponse(void *handle,UpnpString *headers,char **contentType,int *contentLength,
                       int *httpStatus,int timeout)

{
  int iVar1;
  int timeout_local;
  int *httpStatus_local;
  int *contentLength_local;
  char **contentType_local;
  UpnpString *headers_local;
  void *handle_local;
  
  iVar1 = http_GetHttpResponse(handle,headers,contentType,contentLength,httpStatus,timeout);
  return iVar1;
}

Assistant:

int UpnpGetHttpResponse(void *handle,
	UpnpString *headers,
	char **contentType,
	int *contentLength,
	int *httpStatus,
	int timeout)
{
	return http_GetHttpResponse(handle,
		headers,
		contentType,
		contentLength,
		httpStatus,
		timeout);
}